

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbuffer.cpp
# Opt level: O1

qint64 __thiscall QBuffer::writeData(QBuffer *this,char *data,qint64 len)

{
  QObjectData *pQVar1;
  QBindingStatus *pQVar2;
  Data *pDVar3;
  CompatPropertySafePoint *pCVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  HANDLE size;
  long in_FS_OFFSET;
  void *local_48;
  char *pcStack_40;
  QMetaTypeInterface *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QIODevice).super_QObject.d_ptr.d;
  iVar5 = (*(this->super_QIODevice).super_QObject._vptr_QObject[0xf])();
  size = (HANDLE)(CONCAT44(extraout_var,iVar5) + len);
  pQVar2 = pQVar1[4].bindingStorage.bindingStatus;
  if (pQVar2->threadId < size) {
    QByteArray::resize((QByteArray *)pQVar2,(qsizetype)size);
    if ((pQVar1[4].bindingStorage.bindingStatus)->threadId != size) {
      writeData();
      len = -1;
      goto LAB_00222543;
    }
  }
  pQVar2 = pQVar1[4].bindingStorage.bindingStatus;
  pDVar3 = ((DataPointer *)&pQVar2->currentlyEvaluatingBinding)->d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QByteArray::reallocData((QByteArray *)pQVar2,(qsizetype)pQVar2->threadId,KeepSize);
  }
  pCVar4 = pQVar2->currentCompatProperty;
  iVar5 = (*(this->super_QIODevice).super_QObject._vptr_QObject[0xf])(this);
  memcpy((char *)((long)&pCVar4->property + CONCAT44(extraout_var_00,iVar5)),data,len);
  pQVar1[5].children.d.d =
       (Data *)((long)&((pQVar1[5].children.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + len);
  if (((*(int *)&pQVar1[5].children.d.ptr != 0) &&
      (*(char *)((long)&pQVar1[5].children.d.ptr + 4) == '\0')) &&
     ((((this->super_QIODevice).super_QObject.d_ptr.d)->field_0x30 & 2) == 0)) {
    *(undefined1 *)((long)&pQVar1[5].children.d.ptr + 4) = 1;
    local_48 = (void *)0x0;
    pcStack_40 = (char *)0x0;
    local_38 = (QMetaTypeInterface *)0x0;
    QMetaObject::invokeMethodImpl
              ((QObject *)this,"_q_emitSignals",QueuedConnection,1,&local_48,&pcStack_40,&local_38);
  }
LAB_00222543:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return len;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QBuffer::writeData(const char *data, qint64 len)
{
    Q_D(QBuffer);
    const quint64 required = quint64(pos()) + quint64(len); // cannot overflow (pos() ≥ 0, len ≥ 0)

    if (required > quint64(d->buf->size())) { // capacity exceeded
        // The following must hold, since qsizetype covers half the virtual address space:
        Q_ASSERT(required <= quint64((std::numeric_limits<qsizetype>::max)()));
        d->buf->resize(qsizetype(required));
        if (quint64(d->buf->size()) != required) { // could not resize
            qWarning("QBuffer::writeData: Memory allocation error");
            return -1;
        }
    }

    memcpy(d->buf->data() + pos(), data, size_t(len));

#ifndef QT_NO_QOBJECT
    d->writtenSinceLastEmit += len;
    if (d->signalConnectionCount && !d->signalsEmitted && !signalsBlocked()) {
        d->signalsEmitted = true;
        QMetaObject::invokeMethod(this, "_q_emitSignals", Qt::QueuedConnection);
    }
#endif
    return len;
}